

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict4 index,
          aiNode *parent,aiNode *root_node,aiMatrix4x4 *absolute_transform)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  int *piVar5;
  aiVector3D *paVar6;
  ShapeGeometry *this_00;
  pointer ppaVar7;
  pointer ppaVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  MeshGeometry *pMVar15;
  aiAnimMesh *paVar16;
  aiMesh *paVar17;
  MatIndexArray *pMVar18;
  Skin *pSVar19;
  pointer puVar20;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar21
  ;
  aiVector3D *paVar22;
  ulong *puVar23;
  long lVar24;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar25;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar26;
  aiColor4D *paVar27;
  uint *puVar28;
  mapped_type *pmVar29;
  const_reference ppSVar30;
  const_reference pvVar31;
  const_reference pvVar32;
  iterator iVar33;
  aiAnimMesh **ppaVar34;
  reference ppaVar35;
  undefined4 in_register_0000000c;
  int *piVar36;
  aiFace *paVar37;
  Model *model_00;
  uint i_1;
  ulong uVar38;
  ulong uVar39;
  size_type __n;
  uint uVar40;
  long lVar41;
  pointer ppBVar42;
  FBXConverter *this_01;
  pointer ppBVar43;
  uint i;
  FBXConverter *__n_00;
  uint j;
  uint uVar44;
  long lVar45;
  aiFace *paVar46;
  float fVar47;
  aiVector3t<float> aVar48;
  uint in_cursor;
  aiMesh *local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_190;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_188;
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  *local_180;
  BlendShapeChannel *local_178;
  MeshGeometry *local_170;
  undefined4 local_164;
  pointer local_160;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_158;
  aiAnimMesh *animMesh;
  aiFace *local_148;
  MatIndexArray *local_140;
  uint count;
  FBXConverter *local_130;
  pointer local_128;
  uint outIndex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  aiVector3D normal;
  aiVector3D vertex;
  undefined4 uStack_74;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  
  local_160 = (pointer)CONCAT44(in_register_0000000c,index);
  paVar17 = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  pMVar18 = MeshGeometry::GetMaterialIndices(mesh);
  local_188 = MeshGeometry::GetVertices(mesh);
  local_190 = MeshGeometry::GetFaceIndexCounts(mesh);
  uVar44 = 0;
  local_164 = 0;
  local_130 = this;
  if (this->doc->settings->readWeights == true) {
    pSVar19 = Geometry::DeformerSkin(&mesh->super_Geometry);
    local_164 = (undefined4)CONCAT71((int7)((ulong)pSVar19 >> 8),pSVar19 != (Skin *)0x0);
  }
  puVar20 = (local_190->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar40 = 0;
  for (piVar36 = (pMVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      piVar36 !=
      (pMVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish; piVar36 = piVar36 + 1) {
    if (*piVar36 == (int)local_160) {
      uVar40 = uVar40 + 1;
      uVar44 = uVar44 + *puVar20;
    }
    puVar20 = puVar20 + 1;
  }
  local_140 = pMVar18;
  if (uVar40 == 0) {
    __assert_fail("count_faces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x50e,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                 );
  }
  if (uVar44 == 0) {
    __assert_fail("count_vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x50f,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                 );
  }
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((char)local_164 != '\0') ||
     (pvVar21 = Geometry::GetBlendShapes(&mesh->super_Geometry),
     (pvVar21->
     super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
     )._M_impl.super__Vector_impl_data._M_finish !=
     (pvVar21->
     super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
     )._M_impl.super__Vector_impl_data._M_start)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&reverseMapping,(ulong)uVar44);
  }
  paVar17->mNumVertices = uVar44;
  uVar38 = (ulong)uVar44 * 0xc;
  paVar22 = (aiVector3D *)operator_new__(uVar38);
  uVar38 = uVar38 - 0xc;
  memset(paVar22,0,(uVar38 - uVar38 % 0xc) + 0xc);
  paVar17->mVertices = paVar22;
  paVar17->mNumFaces = uVar40;
  uVar38 = (ulong)uVar40;
  puVar23 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
  *puVar23 = uVar38;
  paVar46 = (aiFace *)(puVar23 + 1);
  paVar37 = paVar46;
  do {
    paVar37->mNumIndices = 0;
    paVar37->mIndices = (uint *)0x0;
    paVar37 = paVar37 + 1;
  } while (paVar37 != (aiFace *)(puVar23 + uVar38 * 2 + 1));
  paVar17->mFaces = paVar46;
  local_198 = paVar17;
  local_170 = mesh;
  local_158 = MeshGeometry::GetNormals(mesh);
  uVar38 = 0xffffffffffffffff;
  lVar24 = (long)(local_158->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_158->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar24 != 0) {
    paVar3 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar24 != (long)paVar4 - (long)paVar3) {
      __assert_fail("normals.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x523,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                   );
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(SEXT816(lVar24) / SEXT816(0xc),0);
    uVar39 = SUB168(auVar9 * ZEXT816(0xc),0);
    if (SUB168(auVar9 * ZEXT816(0xc),8) != 0) {
      uVar39 = uVar38;
    }
    paVar22 = (aiVector3D *)operator_new__(uVar39);
    lVar24 = (long)paVar4 - (long)paVar3;
    if (lVar24 != 0) {
      uVar39 = lVar24 - 0xc;
      memset(paVar22,0,(uVar39 - uVar39 % 0xc) + 0xc);
    }
    local_198->mNormals = paVar22;
  }
  pMVar15 = local_170;
  local_178 = (BlendShapeChannel *)MeshGeometry::GetTangents(local_170);
  local_180 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               *)MeshGeometry::GetBinormals(pMVar15);
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar24 = (long)(local_178->super_Deformer).super_Object.element -
           (long)((_Vector_impl_data *)&(local_178->super_Deformer).super_Object._vptr_Object)->
                 _M_start;
  local_148 = paVar46;
  if (lVar24 != 0) {
    if ((((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
         &local_180->
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
         )->_M_impl).super__Vector_impl_data._M_finish ==
        (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
         &local_180->
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
         )->_M_impl).super__Vector_impl_data._M_start) {
      lVar24 = (long)(local_158->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_158->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar24 == 0) {
        local_180 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                     *)0x0;
        goto LAB_00518f5c;
      }
      local_180 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   *)&tempBinormals;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_180,
                 lVar24 / 0xc);
      uVar44 = 0;
      while( true ) {
        uVar39 = (ulong)uVar44;
        paVar3 = ((_Vector_impl_data *)&(local_178->super_Deformer).super_Object._vptr_Object)->
                 _M_start;
        lVar24 = (long)(local_178->super_Deformer).super_Object.element - (long)paVar3;
        if ((ulong)(lVar24 / 0xc) <= uVar39) break;
        aVar48 = operator^((local_158->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar39,paVar3 + uVar39);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar39].x = (float)(int)aVar48._0_8_;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar39].y =
             (float)(int)((ulong)aVar48._0_8_ >> 0x20);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar39].z = aVar48.z;
        uVar44 = uVar44 + 1;
      }
    }
    paVar3 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar41 = (long)paVar4 - (long)paVar3;
    if ((lVar24 != lVar41) ||
       ((long)(((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &local_180->
                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               )->_M_impl).super__Vector_impl_data._M_finish -
        (long)(((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &local_180->
                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               )->_M_impl).super__Vector_impl_data._M_start != lVar24)) {
      __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x53e,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                   );
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(SEXT816(lVar41) / SEXT816(0xc),0);
    uVar39 = SUB168(auVar10 * ZEXT816(0xc),0);
    if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
      uVar39 = uVar38;
    }
    paVar22 = (aiVector3D *)operator_new__(uVar39);
    lVar24 = (long)paVar4 - (long)paVar3;
    if (lVar24 != 0) {
      uVar39 = lVar24 - 0xc;
      memset(paVar22,0,(uVar39 - uVar39 % 0xc) + 0xc);
    }
    local_198->mTangents = paVar22;
    paVar3 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(SEXT816((long)paVar4 - (long)paVar3) / SEXT816(0xc),0);
    uVar39 = SUB168(auVar11 * ZEXT816(0xc),0);
    if (SUB168(auVar11 * ZEXT816(0xc),8) != 0) {
      uVar39 = uVar38;
    }
    paVar22 = (aiVector3D *)operator_new__(uVar39);
    lVar24 = (long)paVar4 - (long)paVar3;
    if (lVar24 != 0) {
      uVar39 = lVar24 - 0xc;
      memset(paVar22,0,(uVar39 - uVar39 % 0xc) + 0xc);
    }
    local_198->mBitangents = paVar22;
  }
LAB_00518f5c:
  lVar24 = 0;
  while ((lVar24 != 8 &&
         (pvVar25 = MeshGeometry::GetTextureCoords(local_170,(uint)lVar24),
         (pvVar25->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start !=
         (pvVar25->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish))) {
    paVar3 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(SEXT816((long)paVar4 - (long)paVar3) / SEXT816(0xc),0);
    uVar39 = uVar38;
    if (SUB168(auVar12 * ZEXT816(0xc),8) == 0) {
      uVar39 = SUB168(auVar12 * ZEXT816(0xc),0);
    }
    paVar22 = (aiVector3D *)operator_new__(uVar39);
    lVar41 = (long)paVar4 - (long)paVar3;
    if (lVar41 != 0) {
      uVar39 = lVar41 - 0xc;
      memset(paVar22,0,(uVar39 - uVar39 % 0xc) + 0xc);
    }
    local_198->mTextureCoords[lVar24] = paVar22;
    local_198->mNumUVComponents[lVar24] = 2;
    lVar24 = lVar24 + 1;
  }
  lVar41 = 0;
  while ((lVar41 != 8 &&
         (pvVar26 = MeshGeometry::GetVertexColors(local_170,(uint)lVar41),
         (pvVar26->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_start !=
         (pvVar26->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_finish))) {
    paVar3 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_188->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar38 = ((long)paVar4 - (long)paVar3) / 0xc;
    uVar39 = uVar38 << 4;
    paVar27 = (aiColor4D *)operator_new__(-(ulong)(uVar38 >> 0x3c != 0) | uVar39);
    if (paVar4 != paVar3) {
      memset(paVar27,0,uVar39);
    }
    local_198->mColors[lVar41] = paVar27;
    lVar41 = lVar41 + 1;
  }
  in_cursor = 0;
  ppBVar42 = (pointer)(local_190->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
  piVar36 = (local_140->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (local_140->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  paVar37 = local_148;
  for (; pMVar15 = local_170, paVar17 = local_198, piVar36 != piVar5; piVar36 = piVar36 + 1) {
    uVar44 = *(uint *)ppBVar42;
    if (*piVar36 == (int)local_160) {
      paVar37->mNumIndices = uVar44;
      local_128 = ppBVar42;
      puVar28 = (uint *)operator_new__((long)(ulong)uVar44 * 4);
      paVar37->mIndices = puVar28;
      uVar40 = 8;
      if (uVar44 - 1 < 3) {
        uVar40 = *(uint *)(&DAT_006012d0 + (ulong)(uVar44 - 1) * 4);
      }
      paVar46 = paVar37 + 1;
      local_198->mPrimitiveTypes = uVar40 | local_198->mPrimitiveTypes;
      local_148 = paVar37;
      local_140 = (MatIndexArray *)(ulong)uVar44;
      for (pMVar18 = (MatIndexArray *)0x0; ppBVar42 = local_128, pMVar18 != local_140;
          pMVar18 = (MatIndexArray *)
                    ((long)&(pMVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1)) {
        local_148->mIndices[(long)pMVar18] = (uint)local_190;
        uVar38 = (ulong)local_190 & 0xffffffff;
        if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar38] = in_cursor;
          pmVar29 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[](&translateIndexMap,&in_cursor);
          *pmVar29 = (mapped_type)local_190;
        }
        uVar39 = (ulong)in_cursor;
        paVar3 = (local_188->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        paVar22 = local_198->mVertices;
        paVar22[uVar38].z = paVar3[uVar39].z;
        paVar3 = paVar3 + uVar39;
        fVar47 = paVar3->y;
        paVar22 = paVar22 + uVar38;
        paVar22->x = paVar3->x;
        paVar22->y = fVar47;
        paVar22 = local_198->mNormals;
        if (paVar22 != (aiVector3D *)0x0) {
          paVar3 = (local_158->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar22[uVar38].z = paVar3[uVar39].z;
          paVar3 = paVar3 + uVar39;
          fVar47 = paVar3->y;
          paVar22[uVar38].x = paVar3->x;
          paVar22[uVar38].y = fVar47;
        }
        paVar22 = local_198->mTangents;
        if (paVar22 != (aiVector3D *)0x0) {
          paVar3 = ((_Vector_impl_data *)&(local_178->super_Deformer).super_Object._vptr_Object)->
                   _M_start;
          paVar22[uVar38].z = paVar3[uVar39].z;
          paVar3 = paVar3 + uVar39;
          fVar47 = paVar3->y;
          paVar22[uVar38].x = paVar3->x;
          paVar22[uVar38].y = fVar47;
          paVar3 = (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    &local_180->
                     super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                    )->_M_impl).super__Vector_impl_data._M_start;
          paVar22 = local_198->mBitangents;
          paVar22[uVar38].z = paVar3[uVar39].z;
          paVar3 = paVar3 + uVar39;
          fVar47 = paVar3->y;
          paVar22 = paVar22 + uVar38;
          paVar22->x = paVar3->x;
          paVar22->y = fVar47;
        }
        for (lVar45 = 0; lVar24 != lVar45; lVar45 = lVar45 + 1) {
          pvVar25 = MeshGeometry::GetTextureCoords(local_170,(uint)lVar45);
          paVar6 = local_198->mTextureCoords[lVar45];
          paVar1 = (pvVar25->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start + in_cursor;
          fVar47 = paVar1->y;
          paVar22 = paVar6 + uVar38;
          paVar22->x = paVar1->x;
          paVar22->y = fVar47;
          paVar6[uVar38].z = 0.0;
        }
        for (lVar45 = 0; lVar41 != lVar45; lVar45 = lVar45 + 1) {
          pvVar26 = MeshGeometry::GetVertexColors(local_170,(uint)lVar45);
          paVar2 = (pvVar26->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_start + in_cursor;
          fVar47 = paVar2->g;
          fVar13 = paVar2->b;
          fVar14 = paVar2->a;
          paVar27 = local_198->mColors[lVar45] + uVar38;
          paVar27->r = paVar2->r;
          paVar27->g = fVar47;
          paVar27->b = fVar13;
          paVar27->a = fVar14;
        }
        local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    (ulong)((int)local_190 + 1);
        in_cursor = in_cursor + 1;
      }
    }
    else {
      in_cursor = in_cursor + uVar44;
      paVar46 = paVar37;
    }
    ppBVar42 = (pointer)((long)ppBVar42 + 4);
    paVar37 = paVar46;
  }
  ConvertMaterialForMesh(local_130,local_198,model,local_170,(int)local_160);
  if ((char)local_164 != '\0') {
    ConvertWeights(local_130,paVar17,model_00,pMVar15,absolute_transform,parent,root_node,
                   (uint)local_160,&reverseMapping);
  }
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar21 = Geometry::GetBlendShapes(&pMVar15->super_Geometry);
  pMVar18 = (MatIndexArray *)
            (pvVar21->
            super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppBVar42 = (pvVar21->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_140 = pMVar18;
  while (paVar17 = local_198, (MatIndexArray *)ppBVar42 != pMVar18) {
    local_160 = ((*ppBVar42)->blendShapeChannels).
                super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_128 = ppBVar42;
    for (ppBVar43 = ((*ppBVar42)->blendShapeChannels).
                    super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar43 != local_160;
        ppBVar43 = ppBVar43 + 1) {
      local_178 = *ppBVar43;
      local_180 = &local_178->shapeGeometries;
      for (__n_00 = (FBXConverter *)0x0;
          __n_00 < (FBXConverter *)
                   ((long)(local_178->shapeGeometries).
                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_178->shapeGeometries).
                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n_00 = (FBXConverter *)((long)&__n_00->defaultMaterialIndex + 1)) {
        animMesh = aiCreateAnimMesh(local_198);
        this_01 = __n_00;
        ppSVar30 = std::
                   vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   ::at(local_180,(size_type)__n_00);
        this_00 = *ppSVar30;
        local_148 = (aiFace *)ShapeGeometry::GetVertices(this_00);
        local_158 = ShapeGeometry::GetNormals(this_00);
        local_188 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ShapeGeometry::GetIndices(this_00);
        paVar16 = animMesh;
        FixAnimMeshName((string *)&vertex,this_01,&(this_00->super_Geometry).super_Object.name);
        uVar38 = CONCAT44(uStack_74,vertex.z);
        if (uVar38 < 0x400) {
          (paVar16->mName).length = (ai_uint32)vertex.z;
          memcpy((paVar16->mName).data,(void *)vertex._0_8_,uVar38);
          (paVar16->mName).data[uVar38] = '\0';
        }
        std::__cxx11::string::~string((string *)&vertex);
        uVar38 = 0;
        while (pMVar18 = local_140,
              uVar38 < (ulong)((long)(local_188->
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_188->
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 2)) {
          pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                               uVar38);
          uVar44 = *pvVar31;
          pvVar32 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_148,uVar38);
          vertex.z = pvVar32->z;
          vertex.x = pvVar32->x;
          vertex.y = pvVar32->y;
          pvVar32 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              (local_158,uVar38);
          normal.z = pvVar32->z;
          normal.x = pvVar32->x;
          normal.y = pvVar32->y;
          count = 0;
          puVar28 = MeshGeometry::ToOutputVertexIndex(local_170,uVar44,&count);
          local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar38;
          for (uVar39 = 0; uVar39 < count; uVar39 = uVar39 + 1) {
            outIndex = puVar28[uVar39];
            iVar33 = std::
                     _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::find(&translateIndexMap._M_t,&outIndex);
            if ((_Rb_tree_header *)iVar33._M_node !=
                &translateIndexMap._M_t._M_impl.super__Rb_tree_header) {
              pmVar29 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[](&translateIndexMap,&outIndex);
              uVar44 = *pmVar29;
              aiVector3t<float>::operator+=(animMesh->mVertices + uVar44,&vertex);
              if (animMesh->mNormals != (aiVector3D *)0x0) {
                aiVector3t<float>::operator+=(animMesh->mNormals + uVar44,&normal);
                aiVector3t<float>::NormalizeSafe(animMesh->mNormals + uVar44);
              }
            }
          }
          uVar38 = (long)local_190 + 1;
        }
        fVar47 = 1.0;
        if (8 < (ulong)((long)(local_178->shapeGeometries).
                              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_178->shapeGeometries).
                             super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          fVar47 = local_178->percent / 100.0;
        }
        animMesh->mWeight = fVar47;
        std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back(&animMeshes,&animMesh);
      }
    }
    ppBVar42 = local_128 + 1;
  }
  if ((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar38 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    local_198->mNumAnimMeshes = (uint)uVar38;
    ppaVar34 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar38 >> 0x3d != 0) |
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    paVar17->mAnimMeshes = ppaVar34;
    for (__n = 0; uVar38 != __n; __n = __n + 1) {
      ppaVar35 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at(&animMeshes,__n);
      paVar17->mAnimMeshes[__n] = *ppaVar35;
    }
  }
  ppaVar7 = (local_130->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar8 = (local_130->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::_Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~_Vector_base
            (&animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&translateIndexMap._M_t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return (int)((ulong)((long)ppaVar7 - (long)ppaVar8) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &mesh, const Model &model,
                                                            MatIndexArray::value_type index,
                                                            aiNode *parent, aiNode *root_node,
                                                            const aiMatrix4x4 &absolute_transform)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != nullptr;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }